

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O1

void fetchleaves(cbtDbvt *pdbvt,cbtDbvtNode *root,tNodeArray *leaves,int depth)

{
  int iVar1;
  cbtDbvtNode **ppcVar2;
  long lVar3;
  int iVar4;
  
  if ((depth == 0) || ((root->field_2).childs[1] == (cbtDbvtNode *)0x0)) {
    iVar1 = leaves->m_size;
    if (iVar1 == leaves->m_capacity) {
      iVar4 = 1;
      if (iVar1 != 0) {
        iVar4 = iVar1 * 2;
      }
      if (leaves->m_capacity < iVar4) {
        if (iVar4 == 0) {
          ppcVar2 = (cbtDbvtNode **)0x0;
        }
        else {
          ppcVar2 = (cbtDbvtNode **)cbtAlignedAllocInternal((long)iVar4 << 3,0x10);
        }
        iVar1 = leaves->m_size;
        if (0 < (long)iVar1) {
          lVar3 = 0;
          do {
            ppcVar2[lVar3] = leaves->m_data[lVar3];
            lVar3 = lVar3 + 1;
          } while (iVar1 != lVar3);
        }
        if (leaves->m_data != (cbtDbvtNode **)0x0) {
          if (leaves->m_ownsMemory == true) {
            cbtAlignedFreeInternal(leaves->m_data);
          }
          leaves->m_data = (cbtDbvtNode **)0x0;
        }
        leaves->m_ownsMemory = true;
        leaves->m_data = ppcVar2;
        leaves->m_capacity = iVar4;
      }
    }
    iVar1 = leaves->m_size;
    leaves->m_data[iVar1] = root;
    leaves->m_size = iVar1 + 1;
  }
  else {
    fetchleaves(pdbvt,(root->field_2).childs[0],leaves,depth + -1);
    fetchleaves(pdbvt,(root->field_2).childs[1],leaves,depth + -1);
    cbtAlignedFreeInternal(pdbvt->m_free);
    pdbvt->m_free = root;
  }
  return;
}

Assistant:

static void fetchleaves(cbtDbvt* pdbvt,
						cbtDbvtNode* root,
						tNodeArray& leaves,
						int depth = -1)
{
	if (root->isinternal() && depth)
	{
		fetchleaves(pdbvt, root->childs[0], leaves, depth - 1);
		fetchleaves(pdbvt, root->childs[1], leaves, depth - 1);
		deletenode(pdbvt, root);
	}
	else
	{
		leaves.push_back(root);
	}
}